

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O0

int mg_init_session_static_vars(void)

{
  mg_value *pmVar1;
  char *unaff_retaddr;
  mg_value *n_val;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  pmVar1 = mg_value_make_integer(CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (((pmVar1 == (mg_value *)0x0) ||
      (mg_default_pull_extra_map = mg_map_make_empty(in_stack_ffffffffffffffec),
      mg_default_pull_extra_map == (mg_map *)0x0)) ||
     (iVar2 = mg_map_insert_unsafe
                        ((mg_map *)n_val,unaff_retaddr,
                         (mg_value *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
     iVar2 != 0)) {
    if (pmVar1 != (mg_value *)0x0) {
      mg_value_destroy((mg_value *)0x104b53);
    }
    if (mg_default_pull_extra_map != (mg_map *)0x0) {
      mg_map_destroy((mg_map *)0x104b6f);
    }
    iVar2 = -0xb;
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mg_init_session_static_vars(void) {
  mg_value *n_val = mg_value_make_integer(-1);
  if (!n_val) {
    goto fatal_failure;
  }
  mg_default_pull_extra_map = mg_map_make_empty(1);
  if (!mg_default_pull_extra_map) {
    goto fatal_failure;
  }
  if (mg_map_insert_unsafe(mg_default_pull_extra_map, "n", n_val) != 0) {
    goto fatal_failure;
  }
  return MG_SUCCESS;

fatal_failure:
  if (n_val) {
    mg_value_destroy(n_val);
  }
  if (mg_default_pull_extra_map) {
    mg_map_destroy(mg_default_pull_extra_map);
  }
  return MG_ERROR_CLIENT_ERROR;
}